

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImGuiNavMoveResult *pIVar2;
  ImGuiNextWindowData *pIVar3;
  ImVec2 *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  char *pcVar9;
  ImGuiViewportP **ppIVar10;
  _func_bool_ImGuiViewport_ptr *p_Var11;
  ImGuiWindow **ppIVar12;
  _func_float_ImGuiViewport_ptr *p_Var13;
  ImGuiViewportP *pIVar14;
  _func_void_ImGuiViewport_ptr *p_Var15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImGuiViewportP *pIVar22;
  ImGuiContext *pIVar23;
  ImGuiContext *pIVar24;
  ImVec4 IVar25;
  bool bVar26;
  bool bVar27;
  uint uVar28;
  undefined4 extraout_EAX;
  ImGuiID IVar29;
  ImGuiInputSource IVar30;
  int iVar31;
  ImGuiContext *g_5;
  ImFont *font;
  ulong uVar32;
  ImGuiWindow *pIVar33;
  int n_3;
  ImGuiID IVar34;
  ulong uVar35;
  ImGuiWindow *pIVar36;
  ImGuiWindow *window;
  long lVar37;
  ulong uVar38;
  ImGuiViewportP **ppIVar39;
  ImGuiContext *g;
  long lVar40;
  ImGuiViewportP *pIVar41;
  ImGuiContext *pIVar42;
  int n_1;
  ImGuiNavDirSourceFlags dir_sources;
  float *pfVar43;
  long lVar44;
  ImGuiNavLayer IVar45;
  float *pfVar46;
  bool *pbVar47;
  int i_1;
  ImGuiNavMoveResult *pIVar48;
  bool bVar49;
  bool bVar50;
  byte bVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  float fVar55;
  float fVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar59 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  ImVec2 IVar64;
  undefined4 uVar66;
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined4 uVar76;
  undefined4 uVar77;
  ImVec4 IVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ImRect IVar81;
  ImVec4 local_98;
  float local_88;
  ImGuiViewportP *local_78;
  ImRect local_68;
  ImGuiContext *local_58;
  ImVec2 local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar23 = GImGui;
  bVar51 = 0;
  GImGui->ConfigFlagsLastFrame = GImGui->ConfigFlagsCurrFrame;
  if (((pIVar23->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar23->IO).BackendFlags & 2) == 0)) {
    (pIVar23->IO).ConfigWindowsResizeFromEdges = false;
  }
  uVar28 = (pIVar23->IO).ConfigFlags;
  if (((uVar28 >> 10 & 1) != 0) && ((~(pIVar23->IO).BackendFlags & 0x1400U) != 0)) {
    uVar28 = uVar28 & 0xfffffbff;
    (pIVar23->IO).ConfigFlags = uVar28;
  }
  pIVar23->ConfigFlagsCurrFrame = uVar28;
  if (pIVar23->SettingsLoaded == false) {
    pcVar9 = (pIVar23->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
    }
    pIVar23->SettingsLoaded = true;
  }
  if ((0.0 < pIVar23->SettingsDirtyTimer) &&
     (fVar55 = pIVar23->SettingsDirtyTimer - (pIVar23->IO).DeltaTime,
     pIVar23->SettingsDirtyTimer = fVar55, fVar55 <= 0.0)) {
    pcVar9 = (pIVar23->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar23->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
    }
    pIVar23->SettingsDirtyTimer = 0.0;
  }
  pIVar23->Time = (double)(pIVar23->IO).DeltaTime + pIVar23->Time;
  pIVar23->WithinFrameScope = true;
  pIVar23->FrameCount = pIVar23->FrameCount + 1;
  pIVar23->TooltipOverrideCount = 0;
  local_58 = pIVar23;
  pIVar23->WindowsActiveCount = 0;
  pIVar23 = GImGui;
  uVar28 = GImGui->ConfigFlagsCurrFrame;
  if ((uVar28 >> 10 & 1) == 0) {
    local_78 = *(GImGui->Viewports).Data;
    local_68.Min.x = 0.0;
    local_68.Min.y = 0.0;
    local_98._8_8_ = local_98._0_8_;
    local_98._0_8_ = &(GImGui->Viewports).Data;
    local_50 = (GImGui->IO).DisplaySize;
  }
  else {
    local_98._8_8_ = local_98._0_8_;
    local_98._0_8_ = &(GImGui->Viewports).Data;
    for (lVar40 = 0; ppIVar10 = (pIVar23->Viewports).Data, lVar40 < (pIVar23->Viewports).Size;
        lVar40 = lVar40 + 1) {
      p_Var11 = (pIVar23->PlatformIO).Platform_GetWindowMinimized;
      if ((p_Var11 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
         (pIVar41 = ppIVar10[lVar40], pIVar41->PlatformWindowCreated == true)) {
        bVar49 = (*p_Var11)(&pIVar41->super_ImGuiViewport);
        (pIVar41->super_ImGuiViewport).Flags =
             (uint)bVar49 << 7 | (pIVar41->super_ImGuiViewport).Flags & 0xffffff7fU;
      }
    }
    local_78 = *ppIVar10;
    IVar57 = (*(pIVar23->PlatformIO).Platform_GetWindowPos)(&local_78->super_ImGuiViewport);
    local_68.Min.x = IVar57.x;
    local_68.Min.y = IVar57.y;
    local_50 = (pIVar23->IO).DisplaySize;
    if (((local_78->super_ImGuiViewport).Flags & 0x80) != 0) {
      IVar57 = (local_78->super_ImGuiViewport).Pos;
      local_68.Min.x = IVar57.x;
      local_68.Min.y = IVar57.y;
      local_50 = (local_78->super_ImGuiViewport).Size;
    }
  }
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_68.Min,&local_50,0x200);
  pIVar23->CurrentDpiScale = 0.0;
  ppIVar10 = &pIVar23->MouseLastHoveredViewport;
  pIVar23->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar23->MouseViewport = (ImGuiViewportP *)0x0;
  uVar32 = 0;
LAB_00147370:
  iVar31 = (int)uVar32;
  while (iVar31 < (pIVar23->Viewports).Size) {
    lVar40 = *(long *)local_98._0_8_;
    pIVar41 = *(ImGuiViewportP **)(lVar40 + uVar32 * 8);
    *(int *)&(pIVar41->super_ImGuiViewport).field_0x54 = iVar31;
    if ((iVar31 == 0) || (pIVar23->FrameCount + -2 <= pIVar41->LastFrameActive)) goto LAB_00147408;
    uVar53 = (pIVar23->Windows).Size;
    uVar35 = (ulong)uVar53;
    if ((int)uVar53 < 1) {
      uVar35 = 0;
    }
    for (uVar38 = 0; uVar35 != uVar38; uVar38 = uVar38 + 1) {
      ppIVar12 = (pIVar23->Windows).Data;
      pIVar33 = ppIVar12[uVar38];
      if (pIVar33->Viewport == pIVar41) {
        pIVar33->Viewport = (ImGuiViewportP *)0x0;
        ppIVar12[uVar38]->ViewportOwned = false;
      }
    }
    if (pIVar41 == *ppIVar10) {
      *ppIVar10 = (ImGuiViewportP *)0x0;
    }
    ImVector<ImGuiViewportP_*>::erase(&pIVar23->Viewports,(ImGuiViewportP **)(lVar40 + uVar32 * 8));
    DestroyPlatformWindow(pIVar41);
    IM_DELETE<ImGuiViewportP>(pIVar41);
  }
  if ((uVar28 >> 10 & 1) == 0) goto LAB_00147564;
  if (((pIVar23->IO).BackendFlags & 0x800) != 0) {
    IVar34 = (pIVar23->IO).MouseHoveredViewport;
    if ((IVar34 == 0) ||
       (local_78 = (ImGuiViewportP *)FindViewportByID(IVar34), local_78 == (ImGuiViewportP *)0x0))
    goto LAB_00147985;
    if (((local_78->super_ImGuiViewport).Flags & 0x10) == 0) {
      bVar49 = false;
      pIVar41 = local_78;
      goto LAB_00147d5f;
    }
  }
  pIVar42 = GImGui;
  IVar57 = (pIVar23->IO).MousePos;
  fVar55 = IVar57.y;
  local_78 = (ImGuiViewportP *)0x0;
  for (lVar40 = 0; lVar40 < (pIVar42->Viewports).Size; lVar40 = lVar40 + 1) {
    pIVar41 = (pIVar42->Viewports).Data[lVar40];
    if (((pIVar41->super_ImGuiViewport).Flags & 0x90) == 0) {
      IVar81 = ImGuiViewportP::GetRect(pIVar41);
      local_88 = IVar57.x;
      if (((((IVar81.Min.x <= local_88) && (IVar81.Min.y <= fVar55)) && (local_88 < IVar81.Max.x))
          && (fVar55 < IVar81.Max.y)) &&
         ((local_78 == (ImGuiViewportP *)0x0 ||
          (local_78->LastFrontMostStampCount < pIVar41->LastFrontMostStampCount)))) {
        local_78 = pIVar41;
      }
    }
  }
  if (local_78 == (ImGuiViewportP *)0x0) {
LAB_00147985:
    local_78 = *ppIVar10;
    if (local_78 == (ImGuiViewportP *)0x0) {
      local_78 = (ImGuiViewportP *)**(undefined8 **)local_98._0_8_;
      bVar49 = true;
      pIVar41 = (ImGuiViewportP *)0x0;
      goto LAB_00147d5f;
    }
    bVar49 = true;
    pIVar41 = (ImGuiViewportP *)0x0;
  }
  else {
    bVar49 = false;
    pIVar41 = local_78;
LAB_00147d5f:
    *ppIVar10 = local_78;
  }
  ppIVar39 = &pIVar23->MovingWindow->Viewport;
  if (pIVar23->MovingWindow == (ImGuiWindow *)0x0) {
    ppIVar39 = ppIVar10;
  }
  if (pIVar23->DragDropActive == false) {
    local_78 = pIVar41;
  }
  if (!bVar49) {
    local_78 = pIVar41;
  }
  pIVar14 = *ppIVar39;
  pIVar23->MouseViewport = pIVar14;
  pIVar22 = local_78;
  if ((((pIVar23->DragDropActive != false) || (pIVar23->ActiveId == 0)) ||
      (bVar49 = IsAnyMouseDown(), pIVar22 = pIVar41, !bVar49)) &&
     (((pIVar22 != (ImGuiViewportP *)0x0 && (pIVar22 != pIVar14)) &&
      (((local_78->super_ImGuiViewport).Flags & 0x10) == 0)))) {
LAB_00147564:
    pIVar23->MouseViewport = local_78;
  }
  pIVar23 = local_58;
  ((local_58->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  lVar40 = 0;
  IVar25 = _DAT_002002d0;
  while( true ) {
    IVar69 = IVar25;
    uVar32 = (ulong)(pIVar23->Viewports).Size;
    if ((long)uVar32 <= lVar40) break;
    uVar32 = IVar69._8_8_;
    IVar81 = ImGuiViewportP::GetRect((pIVar23->Viewports).Data[lVar40]);
    fVar55 = IVar69.y;
    uVar35 = CONCAT44(-(uint)(IVar81.Min.y < fVar55),-(uint)(IVar81.Min.x < IVar69.x));
    auVar16._4_8_ = uVar32;
    auVar16._0_4_ = fVar55;
    auVar70._0_8_ = auVar16._0_8_ << 0x20;
    auVar70._8_4_ = IVar69.z;
    auVar70._12_4_ = IVar69.w;
    auVar17._4_8_ = auVar70._8_8_;
    auVar17._0_4_ = -(uint)(fVar55 < IVar81.Min.y);
    auVar71._0_8_ = auVar17._0_8_ << 0x20;
    auVar71._8_4_ = -(uint)(IVar69.z < IVar81.Max.x);
    auVar71._12_4_ = -(uint)(IVar69.w < IVar81.Max.y);
    auVar60._0_8_ = (ulong)IVar81.Min & uVar35;
    auVar60._8_8_ = (ulong)IVar81.Max & auVar71._8_8_;
    auVar72._0_8_ = ~uVar35 & IVar69._0_8_;
    auVar72._8_8_ = ~auVar71._8_8_ & IVar69._8_8_;
    lVar40 = lVar40 + 1;
    IVar25 = (ImVec4)(auVar72 | auVar60);
    local_98 = IVar69;
  }
  (pIVar23->DrawListSharedData).ClipRectFullscreen = IVar69;
  (pIVar23->DrawListSharedData).CurveTessellationTol = (pIVar23->Style).CurveTessellationTol;
  bVar49 = (pIVar23->Style).AntiAliasedLines;
  uVar28 = (uint)bVar49;
  (pIVar23->DrawListSharedData).InitialFlags = (uint)bVar49;
  if ((pIVar23->Style).AntiAliasedFill != false) {
    uVar28 = bVar49 | 2;
    (pIVar23->DrawListSharedData).InitialFlags = uVar28;
  }
  if (((pIVar23->IO).BackendFlags & 8) != 0) {
    (pIVar23->DrawListSharedData).InitialFlags = uVar28 | 4;
  }
  for (lVar40 = 0; lVar40 < (int)uVar32; lVar40 = lVar40 + 1) {
    pIVar41 = (pIVar23->Viewports).Data[lVar40];
    (pIVar41->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    (pIVar41->DrawDataP).Valid = false;
    (pIVar41->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
    (pIVar41->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar41->DrawDataP).CmdListsCount = 0;
    (pIVar41->DrawDataP).TotalIdxCount = 0;
    (pIVar41->DrawDataP).TotalVtxCount = 0;
    (pIVar41->DrawDataP).DisplayPos.x = 0.0;
    *(undefined8 *)&(pIVar41->DrawDataP).DisplayPos.y = 0;
    (pIVar41->DrawDataP).DisplaySize.x = 0.0;
    (pIVar41->DrawDataP).DisplaySize.y = 0.0;
    (pIVar41->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar41->DrawDataP).FramebufferScale.y = 0.0;
    uVar32 = (ulong)(uint)(pIVar23->Viewports).Size;
  }
  if ((pIVar23->DragDropActive != false) &&
     (IVar34 = (pIVar23->DragDropPayload).SourceId, IVar34 == pIVar23->ActiveId)) {
    KeepAliveID(IVar34);
  }
  if (pIVar23->HoveredIdPreviousFrame == 0) {
    IVar34 = pIVar23->HoveredId;
    pIVar23->HoveredIdTimer = 0.0;
    pIVar23->HoveredIdNotActiveTimer = 0.0;
    if (IVar34 == 0) goto LAB_001477a8;
LAB_0014777d:
    fVar55 = (pIVar23->IO).DeltaTime;
    pIVar23->HoveredIdTimer = pIVar23->HoveredIdTimer + fVar55;
    IVar29 = IVar34;
    if (pIVar23->ActiveId != IVar34) {
      pIVar23->HoveredIdNotActiveTimer = fVar55 + pIVar23->HoveredIdNotActiveTimer;
      IVar29 = pIVar23->ActiveId;
    }
  }
  else {
    IVar34 = pIVar23->HoveredId;
    if (IVar34 != 0) {
      if (pIVar23->ActiveId == IVar34) {
        pIVar23->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0014777d;
    }
LAB_001477a8:
    IVar34 = 0;
    IVar29 = pIVar23->ActiveId;
  }
  pIVar23->HoveredIdPreviousFrame = IVar34;
  pIVar23->HoveredId = 0;
  pIVar23->HoveredIdAllowOverlap = false;
  if (((pIVar23->ActiveIdIsAlive != IVar29) && (IVar29 != 0)) &&
     (pIVar23->ActiveIdPreviousFrame == IVar29)) {
    ClearActiveID();
    IVar29 = pIVar23->ActiveId;
  }
  fVar55 = (pIVar23->IO).DeltaTime;
  if (IVar29 != 0) {
    pIVar23->ActiveIdTimer = pIVar23->ActiveIdTimer + fVar55;
  }
  pIVar23->LastActiveIdTimer = pIVar23->LastActiveIdTimer + fVar55;
  pIVar23->ActiveIdPreviousFrame = IVar29;
  pIVar23->ActiveIdPreviousFrameWindow = pIVar23->ActiveIdWindow;
  pIVar23->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar23->ActiveIdHasBeenEditedBefore;
  pIVar23->ActiveIdIsAlive = 0;
  pIVar23->ActiveIdHasBeenEditedThisFrame = false;
  pIVar23->ActiveIdPreviousFrameIsAlive = false;
  pIVar23->ActiveIdIsJustActivated = false;
  if (pIVar23->TempInputTextId == 0) {
LAB_0014788d:
    if (IVar29 == 0) {
      pIVar23->ActiveIdUsingNavDirMask = 0;
      pIVar23->ActiveIdUsingNavInputMask = 0;
      pIVar23->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar29 != pIVar23->TempInputTextId) {
    pIVar23->TempInputTextId = 0;
    goto LAB_0014788d;
  }
  pIVar23->DragDropAcceptIdPrev = pIVar23->DragDropAcceptIdCurr;
  pIVar23->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar23->DragDropAcceptIdCurr = 0;
  pIVar23->DragDropWithinSourceOrTarget = false;
  memcpy((pIVar23->IO).KeysDownDurationPrev,(pIVar23->IO).KeysDownDuration,0x800);
  for (lVar40 = 0x148; pIVar42 = GImGui, lVar40 != 0x348; lVar40 = lVar40 + 1) {
    fVar67 = -1.0;
    if (*(char *)((long)(pIVar23->IO).KeyMap + lVar40 + -0x3c) == '\x01') {
      fVar56 = *(float *)((long)pIVar23 + lVar40 * 4 + -0x80);
      fVar67 = 0.0;
      if (0.0 <= fVar56) {
        fVar67 = fVar56 + fVar55;
      }
    }
    *(float *)((long)pIVar23 + lVar40 * 4 + -0x80) = fVar67;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar28 = (pIVar42->IO).ConfigFlags;
  if (((uVar28 & 2) == 0) || (((pIVar42->IO).BackendFlags & 1) == 0)) {
    bVar18 = 0;
  }
  else if ((((0.0 < (pIVar42->IO).NavInputs[0]) || (0.0 < (pIVar42->IO).NavInputs[2])) ||
           (0.0 < (pIVar42->IO).NavInputs[1])) || (bVar18 = 1, 0.0 < (pIVar42->IO).NavInputs[3])) {
    pIVar42->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar18 = 1;
  }
  if ((uVar28 & 1) != 0) {
    lVar40 = (long)(pIVar42->IO).KeyMap[0xc];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[0] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[0xd];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[2] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[0xe];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[1] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[1];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[0x11] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[2];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[0x12] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[3];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[0x13] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar40 = (long)(pIVar42->IO).KeyMap[4];
    if ((-1 < lVar40) && ((pIVar42->IO).KeysDown[lVar40] == true)) {
      (pIVar42->IO).NavInputs[0x14] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar49 = (pIVar42->IO).KeyCtrl;
    if (bVar49 == true) {
      (pIVar42->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar42->IO).KeyShift == true) {
      (pIVar42->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar49 == false) && ((pIVar42->IO).KeyAlt != false)) {
      (pIVar42->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar1 = (pIVar42->IO).NavInputsDownDuration;
  pfVar43 = pfVar1;
  pfVar46 = (pIVar42->IO).NavInputsDownDurationPrev;
  for (lVar40 = 0x15; lVar40 != 0; lVar40 = lVar40 + -1) {
    *pfVar46 = *pfVar43;
    pfVar43 = pfVar43 + (ulong)bVar51 * -2 + 1;
    pfVar46 = pfVar46 + (ulong)bVar51 * -2 + 1;
  }
  for (lVar40 = 0; lVar40 != 0x15; lVar40 = lVar40 + 1) {
    fVar55 = -1.0;
    if (0.0 < (pIVar42->IO).NavInputs[lVar40]) {
      fVar55 = 0.0;
      if (0.0 <= pfVar1[lVar40]) {
        fVar55 = pfVar1[lVar40] + (pIVar42->IO).DeltaTime;
      }
    }
    pfVar1[lVar40] = fVar55;
  }
  IVar34 = pIVar42->NavInitResultId;
  if ((IVar34 != 0) &&
     (((pIVar42->NavDisableHighlight != true || (pIVar42->NavInitRequestFromMove == true)) &&
      (pIVar33 = pIVar42->NavWindow, pIVar33 != (ImGuiWindow *)0x0)))) {
    IVar45 = pIVar42->NavLayer;
    if (pIVar42->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar34,IVar45,&pIVar42->NavInitResultRectRel);
      pIVar33 = pIVar42->NavWindow;
      IVar45 = pIVar42->NavLayer;
    }
    else {
      pIVar42->NavId = IVar34;
      pIVar33->NavLastIds[(int)IVar45] = IVar34;
    }
    IVar57 = (pIVar42->NavInitResultRectRel).Max;
    pIVar33->NavRectRel[IVar45].Min = (pIVar42->NavInitResultRectRel).Min;
    (&pIVar33->NavRectRel[IVar45].Min)[1] = IVar57;
  }
  pIVar42->NavInitRequest = false;
  pIVar42->NavInitRequestFromMove = false;
  pIVar42->NavInitResultId = 0;
  pIVar42->NavJustMovedToId = 0;
  pIVar23 = GImGui;
  if (pIVar42->NavMoveRequest == true) {
    IVar34 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar34 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar23->NavDisableHighlight = false;
        pIVar23->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar2 = &GImGui->NavMoveResultOther;
      pIVar48 = &GImGui->NavMoveResultLocal;
      if (IVar34 == 0) {
        pIVar48 = pIVar2;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar34 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar34 != 0)) &&
         (IVar34 != GImGui->NavId)) {
        pIVar48 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar48 == pIVar2) {
LAB_00147d03:
        pIVar48 = pIVar2;
      }
      else if ((pIVar2->ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar55 = (GImGui->NavMoveResultOther).DistBox;
        fVar67 = pIVar48->DistBox;
        if (fVar67 <= fVar55) {
          if (((fVar55 != fVar67) || (NAN(fVar55) || NAN(fVar67))) ||
             (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar48->DistCenter < *pfVar1 || pIVar48->DistCenter == *pfVar1)) goto LAB_00147d06;
        }
        goto LAB_00147d03;
      }
LAB_00147d06:
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar57 = pIVar48->Window->Pos;
          IVar8 = (pIVar48->RectRel).Min;
          local_68.Max.x = IVar57.x;
          local_68.Min.x = IVar8.x + local_68.Max.x;
          local_68.Max.y = IVar57.y;
          local_68.Min.y = IVar8.y + local_68.Max.y;
          IVar57 = (pIVar48->RectRel).Max;
          local_68.Max.x = IVar57.x + local_68.Max.x;
          local_68.Max.y = IVar57.y + local_68.Max.y;
          IVar57 = ScrollToBringRectIntoView(pIVar48->Window,&local_68);
        }
        else {
          pIVar33 = pIVar48->Window;
          fVar55 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar55 = (pIVar33->ScrollMax).y;
          }
          IVar57 = (ImVec2)((ulong)(uint)((pIVar33->Scroll).y - fVar55) << 0x20);
          (pIVar33->ScrollTarget).y = fVar55;
          (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar55 = (pIVar48->RectRel).Min.y;
        fVar67 = (pIVar48->RectRel).Max.x;
        fVar56 = (pIVar48->RectRel).Max.y;
        (pIVar48->RectRel).Min.x = (pIVar48->RectRel).Min.x - IVar57.x;
        (pIVar48->RectRel).Min.y = fVar55 - IVar57.y;
        (pIVar48->RectRel).Max.x = fVar67 - IVar57.x;
        (pIVar48->RectRel).Max.y = fVar56 - IVar57.y;
      }
      ClearActiveID();
      pIVar23->NavWindow = pIVar48->Window;
      IVar34 = pIVar48->ID;
      if (pIVar23->NavId != IVar34) {
        pIVar23->NavJustMovedToId = IVar34;
        pIVar23->NavJustMovedToMultiSelectScopeId = pIVar48->SelectScopeId;
      }
      SetNavIDWithRectRel(IVar34,pIVar23->NavLayer,&pIVar48->RectRel);
      pIVar23->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar42->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar42->NavMoveResultLocal).ID == 0) && ((pIVar42->NavMoveResultOther).ID == 0)) {
      pIVar42->NavDisableHighlight = false;
    }
    pIVar42->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar42->NavMousePosDirty == true) && (pIVar42->NavIdIsAlive == true)) {
    if ((((pIVar42->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar42->IO).BackendFlags & 4) != 0 && (pIVar42->NavDisableHighlight == false)) &&
         (pIVar42->NavDisableMouseHover == true)) && (pIVar42->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar57 = NavCalcPreferredRefPos();
      (pIVar42->IO).MousePosPrev = IVar57;
      (pIVar42->IO).MousePos = IVar57;
      (pIVar42->IO).WantSetMousePos = true;
    }
    pIVar42->NavMousePosDirty = false;
  }
  pIVar42->NavIdIsAlive = false;
  pIVar42->NavJustTabbedId = 0;
  pIVar33 = pIVar42->NavWindow;
  pIVar36 = pIVar33;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    for (; pIVar36 != (ImGuiWindow *)0x0; pIVar36 = pIVar36->ParentWindow) {
      if ((pIVar36->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar36 != pIVar33) {
          pIVar36->NavLastChildNavWindow = pIVar33;
        }
        break;
      }
    }
    if ((pIVar33->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar42->NavLayer == ImGuiNavLayer_Main)) {
      pIVar33->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar23 = GImGui;
  pIVar33 = GetTopMostPopupModal();
  if (pIVar33 == (ImGuiWindow *)0x0) {
    if (pIVar23->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00148006;
LAB_0014800d:
      bVar49 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
      if (((pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar23->IO).KeyCtrl == true))
         && (bVar50 = IsKeyPressedMap(0,true), bVar50)) {
        bVar51 = (byte)(pIVar23->IO).ConfigFlags;
        uVar53 = (uint)bVar51;
        if (bVar49 || (bVar51 & 1) != 0) {
LAB_00148052:
          pIVar33 = pIVar23->NavWindow;
          if ((pIVar33 != (ImGuiWindow *)0x0) ||
             (pIVar33 = FindWindowNavFocusable
                                  ((pIVar23->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar33 != (ImGuiWindow *)0x0)) {
            pIVar23->NavWindowingTargetAnim = pIVar33;
            pIVar23->NavWindowingTarget = pIVar33;
            pIVar23->NavWindowingTimer = 0.0;
            pIVar23->NavWindowingHighlightAlpha = 0.0;
            pIVar23->NavWindowingToggleLayer = (bool)(~(byte)uVar53 & 1);
            pIVar23->NavInputSource = ImGuiInputSource_NavGamepad - (uVar53 & 1);
          }
        }
      }
      else if (bVar49) {
        uVar53 = 0;
        goto LAB_00148052;
      }
      bVar49 = pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar55 = (pIVar23->IO).DeltaTime * -10.0 + pIVar23->NavWindowingHighlightAlpha;
        fVar55 = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
        pIVar23->NavWindowingHighlightAlpha = fVar55;
        if ((pIVar23->DimBgRatio <= 0.0) && (fVar55 <= 0.0)) {
          pIVar23->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_0014800d;
      }
LAB_00148006:
      bVar49 = false;
    }
    fVar55 = (pIVar23->IO).DeltaTime + pIVar23->NavWindowingTimer;
    pIVar23->NavWindowingTimer = fVar55;
    if (bVar49) {
LAB_00148229:
      auVar21._8_8_ = 0;
      auVar21._0_4_ = local_98.z;
      auVar21._4_4_ = local_98.w;
      local_98 = (ImVec4)(auVar21 << 0x40);
      pIVar33 = (ImGuiWindow *)0x0;
    }
    else {
      IVar30 = pIVar23->NavInputSource;
      if (IVar30 != ImGuiInputSource_NavGamepad) {
LAB_0014819c:
        if (IVar30 == ImGuiInputSource_NavKeyboard) {
          fVar67 = (pIVar23->NavWindowingTimer + -0.2) / 0.05;
          fVar55 = 1.0;
          if (fVar67 <= 1.0) {
            fVar55 = fVar67;
          }
          fVar55 = (float)(~-(uint)(fVar67 < 0.0) & (uint)fVar55);
          uVar53 = -(uint)(fVar55 <= pIVar23->NavWindowingHighlightAlpha);
          pIVar23->NavWindowingHighlightAlpha =
               (float)(uVar53 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar53 & (uint)fVar55);
          bVar49 = IsKeyPressedMap(0,true);
          if (bVar49) {
            NavUpdateWindowingHighlightWindow((pIVar23->IO).KeyShift - 1 | 1);
          }
          if ((pIVar23->IO).KeyCtrl == false) {
            pIVar33 = pIVar23->NavWindowingTarget;
            auVar19._8_8_ = 0;
            auVar19._0_4_ = local_98.z;
            auVar19._4_4_ = local_98.w;
            local_98 = (ImVec4)(auVar19 << 0x40);
            goto LAB_00148234;
          }
        }
        goto LAB_00148229;
      }
      fVar67 = (fVar55 + -0.2) / 0.05;
      fVar55 = 1.0;
      if (fVar67 <= 1.0) {
        fVar55 = fVar67;
      }
      fVar55 = (float)(~-(uint)(fVar67 < 0.0) & (uint)fVar55);
      uVar53 = -(uint)(fVar55 <= pIVar23->NavWindowingHighlightAlpha);
      pIVar23->NavWindowingHighlightAlpha =
           (float)(uVar53 & (uint)pIVar23->NavWindowingHighlightAlpha | ~uVar53 & (uint)fVar55);
      bVar49 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar50 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar49 - (uint)bVar50 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar49 - (uint)bVar50);
        pIVar23->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00148229;
        IVar30 = pIVar23->NavInputSource;
        goto LAB_0014819c;
      }
      uVar32 = (ulong)GImGui >> 8;
      pbVar47 = &pIVar23->NavWindowingToggleLayer;
      *pbVar47 = (bool)(*pbVar47 &
                       (pIVar23->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar23->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar47 == false) {
        pIVar33 = pIVar23->NavWindowingTarget;
        auVar20._8_8_ = 0;
        auVar20._0_4_ = local_98.z;
        auVar20._4_4_ = local_98.w;
        local_98 = (ImVec4)(auVar20 << 0x40);
      }
      else {
        local_98._1_7_ = (int7)uVar32;
        local_98.x._0_1_ = pIVar23->NavWindow != (ImGuiWindow *)0x0;
        pIVar33 = (ImGuiWindow *)0x0;
      }
      pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_00148234:
    IVar25 = local_98;
    dir_sources = 1;
    bVar49 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
    if (bVar49) {
      pIVar23->NavWindowingToggleLayer = true;
    }
    if (((pIVar23->ActiveId == 0) || (pIVar23->ActiveIdAllowOverlap == true)) &&
       ((pIVar23->NavWindowingToggleLayer == true &&
        (bVar49 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar49)))) {
      local_98._1_7_ = 0;
      local_98.x._0_1_ =
           -(((pIVar23->IO).MousePosPrev.y < -256000.0 || (pIVar23->IO).MousePosPrev.x < -256000.0)
            != (-256000.0 <= (pIVar23->IO).MousePos.x && -256000.0 <= (pIVar23->IO).MousePos.y)) |
           local_98.x._0_1_;
      local_98._8_8_ = IVar25._8_8_;
    }
    pIVar36 = pIVar23->NavWindowingTarget;
    if ((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 4) == 0)) {
      if (pIVar23->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_00148368:
        IVar57 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar57.x = 0.0;
        IVar57.y = 0.0;
        if ((pIVar23->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar23->IO).KeyShift == false)) goto LAB_00148368;
      }
      fVar55 = IVar57.y;
      if (((IVar57.x != 0.0) || (fVar55 != 0.0)) || (NAN(fVar55))) {
        fVar67 = (pIVar23->IO).DisplayFramebufferScale.x;
        fVar56 = (pIVar23->IO).DisplayFramebufferScale.y;
        if (fVar56 <= fVar67) {
          fVar67 = fVar56;
        }
        fVar67 = (float)(int)(fVar67 * (pIVar23->IO).DeltaTime * 800.0);
        IVar8 = pIVar36->RootWindow->Pos;
        local_68.Min.x = IVar8.x + IVar57.x * fVar67;
        local_68.Min.y = IVar8.y + fVar55 * fVar67;
        SetWindowPos(pIVar36->RootWindow,&local_68.Min,1);
        pIVar23->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar23->NavWindowingTarget);
      }
    }
    if (pIVar33 != (ImGuiWindow *)0x0) {
      pIVar36 = pIVar23->NavWindow;
      if (pIVar36 == (ImGuiWindow *)0x0) {
        pIVar41 = (ImGuiViewportP *)0x0;
LAB_0014841d:
        ClearActiveID();
        pIVar23->NavDisableHighlight = false;
        pIVar23->NavDisableMouseHover = true;
        pIVar33 = NavRestoreLastChildNavWindow(pIVar33);
        ClosePopupsOverWindow(pIVar33,false);
        FocusWindow(pIVar33);
        if (pIVar33->NavLastIds[0] == 0) {
          NavInitWindow(pIVar33,false);
        }
        if ((pIVar33->DC).NavLayerActiveMask == 2) {
          pIVar23->NavLayer = ImGuiNavLayer_Menu;
        }
        if ((pIVar33->Viewport != pIVar41) &&
           (p_Var15 = (pIVar23->PlatformIO).Platform_SetWindowFocus,
           p_Var15 != (_func_void_ImGuiViewport_ptr *)0x0)) {
          (*p_Var15)(&pIVar33->Viewport->super_ImGuiViewport);
        }
      }
      else if (pIVar33 != pIVar36->RootWindowDockStop) {
        pIVar41 = pIVar36->Viewport;
        goto LAB_0014841d;
      }
      pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((((undefined1  [16])local_98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (pIVar33 = pIVar23->NavWindow, pIVar36 = pIVar33, pIVar33 != (ImGuiWindow *)0x0)) {
      while (window = pIVar36, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar36 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar33) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar33;
        pIVar33 = pIVar23->NavWindow;
      }
      pIVar23->NavDisableHighlight = false;
      pIVar23->NavDisableMouseHover = true;
      IVar45 = ImGuiNavLayer_Main;
      if (((pIVar33->DC).NavLayerActiveMask & 2) != 0) {
        if (pIVar23->NavLayer == ImGuiNavLayer_Main) {
          IVar45 = ImGuiNavLayer_Menu;
          if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
            pIVar33->NavLastIds[1] = 0;
          }
        }
        else {
          IVar45 = pIVar23->NavLayer ^ ImGuiNavLayer_Menu;
        }
      }
      NavRestoreLayer(IVar45);
    }
  }
  else {
    pIVar23->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar28 & 1) == 0 & (bVar18 ^ 1))) || (pIVar42->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar42->IO).NavActive = false;
LAB_001485b0:
    bVar49 = pIVar42->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar49 = (pIVar42->NavWindow->Flags & 0x40000U) == 0;
    (pIVar42->IO).NavActive = bVar49;
    if (((!bVar49) || (pIVar42->NavId == 0)) ||
       (bVar49 = true, pIVar42->NavDisableHighlight != false)) goto LAB_001485b0;
  }
  (pIVar42->IO).NavVisible = bVar49;
  bVar49 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar49) {
    if (pIVar42->ActiveId == 0) {
      pIVar33 = pIVar42->NavWindow;
      if (((pIVar33 == (ImGuiWindow *)0x0) || ((pIVar33->Flags & 0x5000000U) != 0x1000000)) ||
         ((pIVar33->ParentWindow == (ImGuiWindow *)0x0 || (pIVar33 == pIVar33->RootWindowDockStop)))
         ) {
        iVar31 = (pIVar42->OpenPopupStack).Size;
        if ((long)iVar31 < 1) {
          if (pIVar42->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x5000000U) != 0x1000000)) {
              pIVar33->NavLastIds[0] = 0;
            }
            pIVar42->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar42->OpenPopupStack).Data[(long)iVar31 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar31 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar33->ParentWindow);
        pIVar23 = GImGui;
        IVar34 = pIVar33->ChildId;
        GImGui->NavId = IVar34;
        pIVar23->NavWindow->NavLastIds[0] = IVar34;
        pIVar42->NavIdIsAlive = false;
        if (pIVar42->NavDisableMouseHover == true) {
          pIVar42->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar42->NavActivateId = 0;
  pIVar42->NavActivateDownId = 0;
  pIVar42->NavActivatePressedId = 0;
  pIVar42->NavInputId = 0;
  if (((pIVar42->NavId == 0) || (pIVar42->NavDisableHighlight != false)) ||
     (pIVar42->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001486fb:
    pIVar33 = pIVar42->NavWindow;
    if (pIVar33 == (ImGuiWindow *)0x0) goto LAB_00148760;
    if ((pIVar33->Flags & 0x40000) != 0) {
      pIVar42->NavDisableHighlight = true;
    }
    bVar49 = false;
  }
  else {
    if (pIVar42->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar42->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar49 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar34 = pIVar42->ActiveId;
          IVar29 = pIVar42->NavId;
          if (IVar34 == 0 && bVar49) {
            pIVar42->NavActivateId = IVar29;
            pIVar42->NavActivateDownId = IVar29;
LAB_00148adb:
            pIVar42->NavActivatePressedId = IVar29;
          }
          else if (IVar34 == 0) {
            pIVar42->NavActivateDownId = IVar29;
            if (bVar49) goto LAB_00148adb;
          }
          else {
            bVar50 = IVar34 == IVar29;
            if (!bVar50) goto LAB_001486fb;
            pIVar42->NavActivateDownId = IVar34;
            IVar29 = IVar34;
            if (bVar49 && bVar50) goto LAB_00148adb;
          }
LAB_00148ae2:
          bVar49 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar49) {
            pIVar42->NavInputId = pIVar42->NavId;
          }
        }
        else if (pIVar42->ActiveId == pIVar42->NavId || pIVar42->ActiveId == 0) goto LAB_00148ae2;
      }
      goto LAB_001486fb;
    }
LAB_00148760:
    bVar49 = true;
    pIVar33 = (ImGuiWindow *)0x0;
  }
  pIVar42->NavMoveRequest = false;
  IVar34 = pIVar42->NavNextActivateId;
  if (IVar34 != 0) {
    pIVar42->NavActivateId = IVar34;
    pIVar42->NavActivateDownId = IVar34;
    pIVar42->NavActivatePressedId = IVar34;
    pIVar42->NavInputId = IVar34;
  }
  pIVar42->NavNextActivateId = 0;
  if (pIVar42->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar42->NavMoveDir = -1;
    pIVar42->NavMoveRequestFlags = 0;
    if (((!bVar49) && (pIVar42->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar33->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar49 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar49 ||
          (bVar49 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar49)))) {
        pIVar42->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar49 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar49 ||
          (bVar49 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar49)))) {
        pIVar42->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar49 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar49 ||
          (bVar49 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar49)))) {
        pIVar42->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar49 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar49 ||
          (bVar49 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar49)))) {
        pIVar42->NavMoveDir = 3;
      }
    }
    pIVar42->NavMoveClipDir = pIVar42->NavMoveDir;
  }
  else {
    pIVar42->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar23 = GImGui;
  fVar55 = 0.0;
  if ((((((uVar28 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar33 = GImGui->NavWindow, pIVar33 != (ImGuiWindow *)0x0)) &&
      (((pIVar33->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    iVar31 = (GImGui->IO).KeyMap[5];
    bVar50 = false;
    bVar49 = false;
    if ((-1 < (long)iVar31) && ((GImGui->IO).KeysDown[iVar31] == true)) {
      bVar49 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    iVar52 = (GImGui->IO).KeyMap[6];
    if ((-1 < (long)iVar52) && ((GImGui->IO).KeysDown[iVar52] == true)) {
      bVar50 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar26 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar26) {
      bVar26 = (pIVar23->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar26 = false;
    }
    bVar27 = IsKeyPressed((pIVar23->IO).KeyMap[8],true);
    if (bVar27) {
      bVar27 = (pIVar23->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar27 = false;
    }
    fVar55 = 0.0;
    if ((bVar49 != bVar50) || (bVar26 != bVar27)) {
      if (((pIVar33->DC).NavLayerActiveMask == 0) && ((pIVar33->DC).NavHasScroll == true)) {
        bVar49 = IsKeyPressed(iVar31,true);
        if (bVar49) {
          fVar55 = (pIVar33->Scroll).y - ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y);
LAB_00149c19:
          (pIVar33->ScrollTarget).y = fVar55;
        }
        else {
          bVar49 = IsKeyPressed(iVar52,true);
          if (bVar49) {
            fVar55 = ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) + (pIVar33->Scroll).y
            ;
            goto LAB_00149c19;
          }
          if (bVar26 == false) {
            if (bVar27 == false) goto LAB_00149c2a;
            fVar55 = (pIVar33->ScrollMax).y;
            goto LAB_00149c19;
          }
          (pIVar33->ScrollTarget).y = 0.0;
        }
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
LAB_00149c2a:
        fVar55 = 0.0;
      }
      else {
        fVar55 = (pIVar33->InnerRect).Max.y;
        fVar67 = (pIVar33->InnerRect).Min.y;
        fVar56 = ImGuiWindow::CalcFontSize(pIVar33);
        fVar55 = (pIVar33->NavRectRel[0].Max.y - pIVar33->NavRectRel[0].Min.y) +
                 ((fVar55 - fVar67) - fVar56);
        fVar55 = (float)(~-(uint)(fVar55 <= 0.0) & (uint)fVar55);
        bVar49 = IsKeyPressed((pIVar23->IO).KeyMap[5],true);
        if (bVar49) {
          fVar55 = -fVar55;
          pIVar23->NavMoveDir = 3;
          pIVar23->NavMoveClipDir = 2;
          pIVar23->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar49 = IsKeyPressed((pIVar23->IO).KeyMap[6],true);
          if (!bVar49) {
            if (bVar26 == false) {
              fVar55 = 0.0;
              if (bVar27 != false) {
                fVar67 = ((pIVar33->ScrollMax).y + (pIVar33->SizeFull).y) - (pIVar33->Scroll).y;
                pIVar33->NavRectRel[0].Max.y = fVar67;
                pIVar33->NavRectRel[0].Min.y = fVar67;
                fVar67 = pIVar33->NavRectRel[0].Min.x;
                pIVar4 = &pIVar33->NavRectRel[0].Max;
                if (pIVar4->x <= fVar67 && fVar67 != pIVar4->x) {
                  pIVar33->NavRectRel[0].Max.x = 0.0;
                  pIVar33->NavRectRel[0].Min.x = 0.0;
                }
                pIVar23->NavMoveDir = 2;
                pIVar23->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001488ea;
            }
            fVar55 = -(pIVar33->Scroll).y;
            pIVar33->NavRectRel[0].Max.y = fVar55;
            pIVar33->NavRectRel[0].Min.y = fVar55;
            fVar55 = pIVar33->NavRectRel[0].Min.x;
            pIVar4 = &pIVar33->NavRectRel[0].Max;
            if (pIVar4->x <= fVar55 && fVar55 != pIVar4->x) {
              pIVar33->NavRectRel[0].Max.x = 0.0;
              pIVar33->NavRectRel[0].Min.x = 0.0;
            }
            pIVar23->NavMoveDir = 3;
            pIVar23->NavMoveRequestFlags = 0x50;
            goto LAB_00149c2a;
          }
          pIVar23->NavMoveDir = 2;
          pIVar23->NavMoveClipDir = 3;
          pIVar23->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001488ea:
  if (pIVar42->NavMoveDir == -1) {
    if ((pIVar42->NavMoveRequest & 1U) != 0) goto LAB_00148911;
  }
  else {
    pIVar42->NavMoveRequest = true;
    pIVar42->NavMoveDirLast = pIVar42->NavMoveDir;
LAB_00148911:
    if (pIVar42->NavId == 0) {
      pIVar42->NavInitRequest = true;
      pIVar42->NavInitRequestFromMove = true;
      pIVar42->NavInitResultId = 0;
      pIVar42->NavDisableHighlight = false;
    }
  }
  bVar49 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar49 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar49;
  pIVar33 = pIVar42->NavWindow;
  if (((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x40000) == 0)) &&
     (pIVar42->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar67 = ImGuiWindow::CalcFontSize(pIVar33);
    fVar67 = (float)(int)(fVar67 * 100.0 * (pIVar42->IO).DeltaTime + 0.5);
    if ((((pIVar33->DC).NavLayerActiveMask == 0) && ((pIVar33->DC).NavHasScroll == true)) &&
       (pIVar42->NavMoveRequest == true)) {
      uVar28 = pIVar42->NavMoveDir;
      if (uVar28 < 2) {
        lVar40 = 0x9c;
        lVar37 = 0x94;
        uVar53 = 0;
        lVar44 = 0x84;
      }
      else {
        if ((uVar28 & 0xfffffffe) != 2) goto LAB_00148b76;
        uVar53 = 2;
        lVar40 = 0xa0;
        lVar37 = 0x98;
        lVar44 = 0x88;
      }
      *(float *)((long)&pIVar33->Name + lVar37) =
           (float)(int)(*(float *)(&DAT_00200c90 + (ulong)(uVar28 == uVar53) * 4) * fVar67 +
                       *(float *)((long)&pIVar33->Name + lVar44));
      *(undefined4 *)((long)&pIVar33->Name + lVar40) = 0;
    }
LAB_00148b76:
    IVar57 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar56 = IVar57.x;
    fVar63 = IVar57.y;
    if (((fVar56 != 0.0) || (NAN(fVar56))) && (pIVar33->ScrollbarX == true)) {
      (pIVar33->ScrollTarget).x = (float)(int)(fVar56 * fVar67 + (pIVar33->Scroll).x);
      (pIVar33->ScrollTargetCenterRatio).x = 0.0;
      pIVar42->NavMoveFromClampedRefRect = true;
    }
    if ((fVar63 != 0.0) || (NAN(fVar63))) {
      (pIVar33->ScrollTarget).y = (float)(int)(fVar63 * fVar67 + (pIVar33->Scroll).y);
      (pIVar33->ScrollTargetCenterRatio).y = 0.0;
      pIVar42->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar42->NavMoveResultLocal).ID = 0;
  (pIVar42->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar42->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar42->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar42->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar42->NavMoveResultOther).ID = 0;
  (pIVar42->NavMoveResultOther).SelectScopeId = 0;
  (pIVar42->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar42->NavMoveRequest == true) && (pIVar42->NavMoveFromClampedRefRect == true)) &&
     (pIVar42->NavLayer == ImGuiNavLayer_Main)) {
    pIVar33 = pIVar42->NavWindow;
    IVar57 = (pIVar33->InnerRect).Min;
    IVar8 = (pIVar33->InnerRect).Max;
    fVar67 = (pIVar33->Pos).x;
    fVar56 = (pIVar33->Pos).y;
    local_68.Min.x = (IVar57.x - fVar67) + -1.0;
    local_68.Min.y = (IVar57.y - fVar56) + -1.0;
    local_68.Max.x = (IVar8.x - fVar67) + 1.0;
    local_68.Max.y = (IVar8.y - fVar56) + 1.0;
    bVar49 = ImRect::Contains(&local_68,pIVar33->NavRectRel);
    if (!bVar49) {
      fVar67 = ImGuiWindow::CalcFontSize(pIVar33);
      auVar61._0_4_ = fVar67 * 0.5;
      auVar73._0_4_ = local_68.Max.x - local_68.Min.x;
      auVar73._4_4_ = local_68.Max.y - local_68.Min.y;
      auVar73._8_4_ = local_68.Max.x - local_68.Max.x;
      auVar73._12_4_ = local_68.Max.y - local_68.Max.y;
      auVar61._4_4_ = auVar61._0_4_;
      auVar61._8_4_ = auVar61._0_4_;
      auVar61._12_4_ = auVar61._0_4_;
      auVar74 = minps(auVar73,auVar61);
      local_68.Min.x = auVar74._0_4_ + local_68.Min.x;
      local_68.Min.y = auVar74._4_4_ + local_68.Min.y;
      local_68.Max.x = local_68.Max.x - auVar74._0_4_;
      local_68.Max.y = local_68.Max.y - auVar74._4_4_;
      ImRect::ClipWith(pIVar33->NavRectRel + pIVar42->NavLayer,&local_68);
      pIVar42->NavId = 0;
    }
    pIVar42->NavMoveFromClampedRefRect = false;
  }
  pIVar23 = local_58;
  pIVar33 = pIVar42->NavWindow;
  if (pIVar33 == (ImGuiWindow *)0x0) {
    fVar63 = 1.0;
    fVar68 = 0.0;
    fVar56 = 0.0;
    fVar67 = 0.0;
  }
  else {
    IVar45 = pIVar42->NavLayer;
    fVar63 = pIVar33->NavRectRel[IVar45].Min.x;
    fVar5 = pIVar33->NavRectRel[IVar45].Max.x;
    fVar56 = 0.0;
    if (fVar5 < fVar63) {
      fVar67 = 0.0;
      fVar62 = 0.0;
      fVar68 = 0.0;
    }
    else {
      fVar6 = pIVar33->NavRectRel[IVar45].Min.y;
      fVar7 = pIVar33->NavRectRel[IVar45].Max.y;
      fVar67 = 0.0;
      fVar62 = 0.0;
      fVar68 = 0.0;
      if (fVar6 <= fVar7) {
        fVar67 = fVar5;
        fVar56 = fVar7;
        fVar62 = fVar63;
        fVar68 = fVar6;
      }
    }
    fVar63 = (pIVar33->Pos).x;
    fVar5 = (pIVar33->Pos).y;
    fVar68 = fVar68 + fVar5;
    fVar67 = fVar67 + fVar63;
    fVar56 = fVar56 + fVar5;
    fVar63 = fVar62 + fVar63 + 1.0;
  }
  if (fVar67 <= fVar63) {
    fVar63 = fVar67;
  }
  (pIVar42->NavScoringRectScreen).Min.y = fVar68 + fVar55;
  (pIVar42->NavScoringRectScreen).Max.y = fVar56 + fVar55;
  (pIVar42->NavScoringRectScreen).Min.x = fVar63;
  (pIVar42->NavScoringRectScreen).Max.x = fVar63;
  pIVar42->NavScoringCount = 0;
  pIVar42 = GImGui;
  fVar55 = (GImGui->IO).MousePos.x;
  fVar67 = (GImGui->IO).MousePos.y;
  if ((-256000.0 <= fVar55) && (-256000.0 <= fVar67)) {
    fVar55 = (float)(int)fVar55;
    fVar67 = (float)(int)fVar67;
    (GImGui->LastValidMousePos).x = fVar55;
    (pIVar42->LastValidMousePos).y = fVar67;
    (pIVar42->IO).MousePos.x = fVar55;
    (pIVar42->IO).MousePos.y = fVar67;
  }
  if ((fVar55 < -256000.0) || (fVar67 < -256000.0)) {
LAB_00148eee:
    (pIVar42->IO).MouseDelta.x = 0.0;
    (pIVar42->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar57 = (pIVar42->IO).MousePosPrev;
    fVar56 = IVar57.x;
    if ((fVar56 < -256000.0) || (fVar63 = IVar57.y, fVar63 < -256000.0)) goto LAB_00148eee;
    fVar55 = fVar55 - fVar56;
    fVar63 = fVar67 - fVar63;
    IVar8.y = fVar63;
    IVar8.x = fVar55;
    (pIVar42->IO).MouseDelta = IVar8;
    if (((fVar55 != 0.0) || (fVar63 != 0.0)) || (NAN(fVar63))) {
      pIVar42->NavDisableMouseHover = false;
    }
  }
  IVar57 = (pIVar42->IO).MousePos;
  (pIVar42->IO).MousePosPrev = IVar57;
  fVar55 = IVar57.x;
  for (lVar40 = 0; lVar40 != 5; lVar40 = lVar40 + 1) {
    bVar51 = (pIVar42->IO).MouseDown[lVar40];
    if ((bool)bVar51 == true) {
      fVar56 = (pIVar42->IO).MouseDownDuration[lVar40];
      pbVar47 = (pIVar42->IO).MouseClicked + lVar40;
      *pbVar47 = fVar56 < 0.0;
      pbVar47[10] = false;
      (pIVar42->IO).MouseDownDurationPrev[lVar40] = fVar56;
      if (0.0 <= fVar56) {
        (pIVar42->IO).MouseDownDuration[lVar40] = fVar56 + (pIVar42->IO).DeltaTime;
        (pIVar42->IO).MouseDoubleClicked[lVar40] = false;
        auVar79 = ZEXT816(0);
        if (-256000.0 <= fVar55 && -256000.0 <= fVar67) {
          IVar8 = (pIVar42->IO).MouseClickedPos[lVar40];
          auVar79._0_4_ = fVar55 - IVar8.x;
          auVar79._4_4_ = fVar67 - IVar8.y;
          auVar79._8_8_ = 0;
        }
        fVar56 = (pIVar42->IO).MouseDragMaxDistanceSqr[lVar40];
        fVar63 = auVar79._0_4_ * auVar79._0_4_ + auVar79._4_4_ * auVar79._4_4_;
        uVar28 = -(uint)(fVar63 <= fVar56);
        (pIVar42->IO).MouseDragMaxDistanceSqr[lVar40] =
             (float)(~uVar28 & (uint)fVar63 | (uint)fVar56 & uVar28);
        IVar8 = (pIVar42->IO).MouseDragMaxDistanceAbs[lVar40];
        fVar56 = IVar8.x;
        fVar63 = IVar8.y;
        auVar80._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
        auVar80._8_4_ = auVar79._8_4_ ^ 0x80000000;
        auVar80._12_4_ = auVar79._12_4_ ^ 0x80000000;
        auVar74 = maxps(auVar80,auVar79);
        uVar28 = -(uint)(auVar74._0_4_ <= fVar56);
        uVar53 = -(uint)(auVar74._4_4_ <= fVar63);
        (pIVar42->IO).MouseDragMaxDistanceAbs[lVar40] =
             (ImVec2)(CONCAT44(~uVar53 & (uint)auVar74._4_4_,~uVar28 & (uint)auVar74._0_4_) |
                     CONCAT44((uint)fVar63 & uVar53,(uint)fVar56 & uVar28));
      }
      else {
        (pIVar42->IO).MouseDownDuration[lVar40] = 0.0;
        (pIVar42->IO).MouseDoubleClicked[lVar40] = false;
        dVar78 = pIVar42->Time;
        if ((float)(dVar78 - (pIVar42->IO).MouseClickedTime[lVar40]) <
            (pIVar42->IO).MouseDoubleClickTime) {
          fVar56 = 0.0;
          fVar63 = 0.0;
          if (-256000.0 <= fVar55 && -256000.0 <= fVar67) {
            IVar8 = (pIVar42->IO).MouseClickedPos[lVar40];
            fVar56 = fVar55 - IVar8.x;
            fVar63 = fVar67 - IVar8.y;
          }
          fVar68 = (pIVar42->IO).MouseDoubleClickMaxDist;
          dVar78 = -3.4028234663852886e+38;
          if (fVar56 * fVar56 + fVar63 * fVar63 < fVar68 * fVar68) {
            (pIVar42->IO).MouseDoubleClicked[lVar40] = true;
            dVar78 = -3.4028234663852886e+38;
          }
        }
        (pIVar42->IO).MouseClickedTime[lVar40] = dVar78;
        (pIVar42->IO).MouseClickedPos[lVar40] = IVar57;
        (pIVar42->IO).MouseDownWasDoubleClick[lVar40] = (pIVar42->IO).MouseDoubleClicked[lVar40];
        pIVar4 = (pIVar42->IO).MouseDragMaxDistanceAbs + lVar40;
        pIVar4->x = 0.0;
        pIVar4->y = 0.0;
        (pIVar42->IO).MouseDragMaxDistanceSqr[lVar40] = 0.0;
        bVar51 = (pIVar42->IO).MouseDown[lVar40];
      }
    }
    else {
      (pIVar42->IO).MouseClicked[lVar40] = false;
      fVar56 = (pIVar42->IO).MouseDownDuration[lVar40];
      (pIVar42->IO).MouseReleased[lVar40] = 0.0 <= fVar56;
      pbVar47 = (pIVar42->IO).MouseClicked + lVar40;
      (pIVar42->IO).MouseDownDurationPrev[lVar40] = fVar56;
      (pIVar42->IO).MouseDownDuration[lVar40] = -1.0;
      (pIVar42->IO).MouseDoubleClicked[lVar40] = false;
    }
    if (((bVar51 & 1) == 0) && ((pIVar42->IO).MouseReleased[lVar40] == false)) {
      (pIVar42->IO).MouseDownWasDoubleClick[lVar40] = false;
    }
    if (*pbVar47 == true) {
      pIVar42->NavDisableMouseHover = false;
    }
  }
  fVar55 = (local_58->IO).DeltaTime;
  iVar31 = local_58->FramerateSecPerFrameIdx;
  local_58->FramerateSecPerFrameAccum =
       (fVar55 - local_58->FramerateSecPerFrame[iVar31]) + local_58->FramerateSecPerFrameAccum;
  local_58->FramerateSecPerFrame[iVar31] = fVar55;
  local_58->FramerateSecPerFrameIdx = (iVar31 + 1) % 0x78;
  uVar28 = -(uint)(0.0 < local_58->FramerateSecPerFrameAccum);
  (local_58->IO).Framerate =
       (float)(~uVar28 & 0x7f7fffff |
              (uint)(1.0 / (local_58->FramerateSecPerFrameAccum / 120.0)) & uVar28);
  DockContextUpdateUndocking(local_58);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar33 = GetTopMostPopupModal();
  if ((pIVar33 != (ImGuiWindow *)0x0) ||
     ((pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar23->NavWindowingHighlightAlpha)))) {
    fVar55 = (pIVar23->IO).DeltaTime * 6.0 + pIVar23->DimBgRatio;
    if (1.0 <= fVar55) {
      fVar55 = 1.0;
    }
    pIVar23->DimBgRatio = fVar55;
  }
  else {
    fVar55 = (pIVar23->IO).DeltaTime * -10.0 + pIVar23->DimBgRatio;
    pIVar23->DimBgRatio = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
  }
  pIVar23->MouseCursor = 0;
  pIVar23->WantTextInputNextFrame = -1;
  pIVar23->WantCaptureMouseNextFrame = -1;
  pIVar23->WantCaptureKeyboardNextFrame = -1;
  (pIVar23->PlatformImePos).x = 1.0;
  (pIVar23->PlatformImePos).y = 1.0;
  pIVar23->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  pIVar42 = GImGui;
  pIVar33 = GImGui->WheelingWindow;
  if (pIVar33 == (ImGuiWindow *)0x0) {
LAB_00149349:
    pIVar33 = (ImGuiWindow *)0x0;
  }
  else {
    fVar67 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar67;
    fVar55 = (pIVar42->IO).MousePos.x;
    if ((((-256000.0 <= fVar55) && (fVar56 = (pIVar42->IO).MousePos.y, -256000.0 <= fVar56)) &&
        (fVar55 = fVar55 - (pIVar42->WheelingWindowRefMousePos).x,
        fVar56 = fVar56 - (pIVar42->WheelingWindowRefMousePos).y,
        fVar63 = (pIVar42->IO).MouseDragThreshold,
        fVar63 * fVar63 < fVar55 * fVar55 + fVar56 * fVar56)) || (fVar67 <= 0.0)) {
      pIVar42->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar42->WheelingWindowTimer = 0.0;
      goto LAB_00149349;
    }
  }
  fVar55 = (pIVar42->IO).MouseWheel;
  if (((((fVar55 != 0.0) || (fVar67 = (pIVar42->IO).MouseWheelH, fVar67 != 0.0)) || (NAN(fVar67)))
      && ((pIVar33 != (ImGuiWindow *)0x0 ||
          (pIVar33 = pIVar42->HoveredWindow, pIVar33 != (ImGuiWindow *)0x0)))) &&
     (pIVar33->Collapsed == false)) {
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((pIVar42->IO).KeyCtrl == true) {
        if ((pIVar42->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar33);
          fVar55 = pIVar33->FontWindowScale;
          fVar56 = (pIVar42->IO).MouseWheel * 0.1 + fVar55;
          fVar67 = 2.5;
          if (fVar56 <= 2.5) {
            fVar67 = fVar56;
          }
          fVar67 = (float)(-(uint)(fVar56 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar56 < 0.5) & (uint)fVar67);
          pIVar33->FontWindowScale = fVar67;
          if ((pIVar33->Flags & 0x1000000) == 0) {
            fVar67 = fVar67 / fVar55;
            IVar57 = pIVar33->Size;
            auVar65._8_8_ = 0;
            auVar65._0_4_ = IVar57.x;
            auVar65._4_4_ = IVar57.y;
            IVar8 = (pIVar42->IO).MousePos;
            local_68.Min.x = (pIVar33->Pos).x;
            local_68.Min.y = (pIVar33->Pos).y;
            auVar75._0_4_ = (IVar8.x - local_68.Min.x) * (1.0 - fVar67) * IVar57.x;
            auVar75._4_4_ = (IVar8.y - local_68.Min.y) * (1.0 - fVar67) * IVar57.y;
            auVar75._8_8_ = 0;
            auVar74 = divps(auVar75,auVar65);
            local_68.Min.x = auVar74._0_4_ + local_68.Min.x;
            local_68.Min.y = auVar74._4_4_ + local_68.Min.y;
            SetWindowPos(pIVar33,&local_68.Min,0);
            IVar58.x = (float)(int)((pIVar33->Size).x * fVar67);
            IVar58.y = (float)(int)((pIVar33->Size).y * fVar67);
            IVar64.x = (float)(int)((pIVar33->SizeFull).x * fVar67);
            IVar64.y = (float)(int)((pIVar33->SizeFull).y * fVar67);
            pIVar33->Size = IVar58;
            pIVar33->SizeFull = IVar64;
          }
          goto LAB_0014938e;
        }
      }
      else if ((pIVar42->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar33);
        while ((uVar28 = pIVar33->Flags, (uVar28 >> 0x18 & 1) != 0 &&
               (((uVar28 & 0x210) == 0x10 ||
                ((fVar67 = (pIVar33->ScrollMax).y, fVar67 == 0.0 && (!NAN(fVar67)))))))) {
          pIVar33 = pIVar33->ParentWindow;
        }
        if ((uVar28 & 0x210) == 0) {
          fVar56 = ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) * 0.67;
          fVar63 = ImGuiWindow::CalcFontSize(pIVar33);
          fVar67 = fVar63 * 5.0;
          if (fVar56 <= fVar63 * 5.0) {
            fVar67 = fVar56;
          }
          (pIVar33->ScrollTarget).y = (pIVar33->Scroll).y - fVar55 * (float)(int)fVar67;
          (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar55 = (pIVar42->IO).MouseWheelH;
    if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar42->IO).KeyShift == true)) {
      fVar55 = (pIVar42->IO).MouseWheel;
      if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar42->IO).KeyShift != true))
      goto LAB_0014938e;
    }
    if ((pIVar42->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar33);
      while ((uVar28 = pIVar33->Flags, (uVar28 >> 0x18 & 1) != 0 &&
             (((uVar28 & 0x210) == 0x10 ||
              ((fVar67 = (pIVar33->ScrollMax).x, fVar67 == 0.0 && (!NAN(fVar67)))))))) {
        pIVar33 = pIVar33->ParentWindow;
      }
      if ((uVar28 & 0x210) == 0) {
        fVar56 = ((pIVar33->InnerRect).Max.x - (pIVar33->InnerRect).Min.x) * 0.67;
        fVar63 = ImGuiWindow::CalcFontSize(pIVar33);
        fVar67 = fVar63 + fVar63;
        if (fVar56 <= fVar63 + fVar63) {
          fVar67 = fVar56;
        }
        (pIVar33->ScrollTarget).x = (pIVar33->Scroll).x - fVar55 * (float)(int)fVar67;
        (pIVar33->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_0014938e:
  pIVar33 = pIVar23->NavWindow;
  if ((((pIVar33 == (ImGuiWindow *)0x0) || (pIVar33->Active != true)) ||
      ((pIVar33->Flags & 0x40000) != 0)) || ((pIVar23->IO).KeyCtrl != false)) {
    bVar49 = false;
  }
  else {
    bVar49 = IsKeyPressedMap(0,true);
  }
  pIVar23->FocusTabPressed = bVar49;
  if ((bVar49 == false) || (pIVar23->ActiveId != 0)) {
    pIVar33 = pIVar23->FocusRequestNextWindow;
  }
  else {
    pIVar33 = pIVar23->NavWindow;
    pIVar23->FocusRequestNextWindow = pIVar33;
    pIVar23->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar23->NavId == 0) || (pIVar23->NavIdTabCounter == 0x7fffffff)) {
      iVar31 = -(uint)(pIVar23->IO).KeyShift;
    }
    else {
      iVar31 = pIVar23->NavIdTabCounter + (-(uint)(pIVar23->IO).KeyShift | 1) + 1;
    }
    pIVar23->FocusRequestNextCounterTab = iVar31;
  }
  pIVar23->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar23->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar23->FocusRequestCurrCounterTab = 0x7fffffff;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar23->FocusRequestCurrWindow = pIVar33;
    if ((pIVar23->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar31 = (pIVar33->DC).FocusCounterAll, iVar31 != -1)) {
      pIVar23->FocusRequestCurrCounterAll =
           (pIVar23->FocusRequestNextCounterAll + iVar31 + 1) % (iVar31 + 1);
    }
    if ((pIVar23->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar31 = (pIVar33->DC).FocusCounterTab, iVar31 != -1)) {
      pIVar23->FocusRequestCurrCounterTab =
           (pIVar23->FocusRequestNextCounterTab + iVar31 + 1) % (iVar31 + 1);
    }
    pIVar23->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar23->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar23->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar23->NavIdTabCounter = 0x7fffffff;
  fVar55 = (pIVar23->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar55) {
    fVar55 = (float)pIVar23->Time - fVar55;
  }
  else {
    fVar55 = 3.4028235e+38;
  }
  for (uVar32 = 0; uVar32 != (uint)(pIVar23->Windows).Size; uVar32 = uVar32 + 1) {
    pIVar33 = (pIVar23->Windows).Data[uVar32];
    bVar49 = pIVar33->Active;
    pIVar33->WasActive = bVar49;
    pIVar33->BeginCount = 0;
    pIVar33->Active = false;
    pIVar33->WriteAccessed = false;
    if (((bVar49 == false) && (pIVar33->MemoryCompacted == false)) &&
       (pIVar33->LastTimeActive <= fVar55 && fVar55 != pIVar33->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar33);
    }
  }
  if ((pIVar23->NavWindow != (ImGuiWindow *)0x0) && (pIVar23->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar23->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar23->BeginPopupStack,0);
  ClosePopupsOverWindow(pIVar23->NavWindow,false);
  DockContextUpdateDocking(pIVar23);
  pIVar42 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if (pIVar42->DebugItemPickerActive == true) {
    uVar28 = pIVar42->HoveredIdPreviousFrame;
    pIVar42->MouseCursor = 7;
    bVar49 = IsKeyPressedMap(0xe,true);
    if (bVar49) {
      pIVar42->DebugItemPickerActive = false;
    }
    pIVar24 = GImGui;
    fVar55 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      uVar53 = (uint)(uVar28 == 0);
    }
    else if (uVar28 == 0) {
      uVar53 = 1;
    }
    else {
      pIVar42->DebugItemPickerBreakID = uVar28;
      pIVar42->DebugItemPickerActive = false;
      uVar53 = 0;
    }
    pIVar3 = &pIVar24->NextWindowData;
    *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
    (pIVar24->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar28);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar53 << 4)),
                "Click to break in debugger!");
    End();
    pIVar42 = GImGui;
  }
  pIVar23->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar42->NextWindowData).Flags = (byte)(pIVar42->NextWindowData).Flags | 2;
  (pIVar42->NextWindowData).SizeVal.x = 400.0;
  (pIVar42->NextWindowData).SizeVal.y = 400.0;
  (pIVar42->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
LAB_00147408:
  bVar49 = pIVar41->PlatformWindowCreated;
  if (((uVar28 >> 10 & 1) != 0) &&
     ((((pIVar41->super_ImGuiViewport).Flags & 0x80) == 0 & bVar49) == 1)) {
    if ((pIVar41->super_ImGuiViewport).PlatformRequestMove == true) {
      IVar57 = (*(pIVar23->PlatformIO).Platform_GetWindowPos)(&pIVar41->super_ImGuiViewport);
      pIVar41->LastPlatformPos = IVar57;
      (pIVar41->super_ImGuiViewport).Pos = IVar57;
    }
    if ((pIVar41->super_ImGuiViewport).PlatformRequestResize == true) {
      IVar57 = (*(pIVar23->PlatformIO).Platform_GetWindowSize)(&pIVar41->super_ImGuiViewport);
      pIVar41->LastPlatformSize = IVar57;
      (pIVar41->super_ImGuiViewport).Size = IVar57;
    }
  }
  UpdateViewportPlatformMonitor(pIVar41);
  pIVar41->Alpha = 1.0;
  if (((pIVar41->super_ImGuiViewport).Flags & 0x200) != 0) {
    pIVar4 = &(pIVar41->super_ImGuiViewport).Pos;
    IVar57 = *pIVar4;
    IVar8 = pIVar41->LastPos;
    iVar52 = -(uint)(IVar57.x - IVar8.x != 0.0);
    iVar54 = -(uint)(IVar57.y - IVar8.y != 0.0);
    auVar59._4_4_ = iVar54;
    auVar59._0_4_ = iVar52;
    auVar59._8_4_ = iVar54;
    auVar59._12_4_ = iVar54;
    auVar74._8_8_ = auVar59._8_8_;
    auVar74._4_4_ = iVar52;
    auVar74._0_4_ = iVar52;
    iVar52 = movmskpd(extraout_EAX,auVar74);
    if (iVar52 != 0) {
      TranslateWindowsInViewport(pIVar41,&pIVar41->LastPos,pIVar4);
    }
  }
  p_Var13 = (pIVar23->PlatformIO).Platform_GetWindowDpiScale;
  if ((p_Var13 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar49 == false)) {
    if ((long)pIVar41->PlatformMonitor == -1) {
      fVar55 = (pIVar41->super_ImGuiViewport).DpiScale;
      uVar53 = -(uint)(fVar55 != 0.0);
      uVar66 = 0;
      fVar55 = (float)(~uVar53 & 0x3f800000 | (uint)fVar55 & uVar53);
      uVar76 = 0;
      uVar77 = 0;
    }
    else {
      fVar55 = (pIVar23->PlatformIO).Monitors.Data[pIVar41->PlatformMonitor].DpiScale;
      uVar66 = 0;
      uVar76 = 0;
      uVar77 = 0;
    }
  }
  else {
    fVar55 = (*p_Var13)(&pIVar41->super_ImGuiViewport);
    uVar66 = extraout_XMM0_Db;
    uVar76 = extraout_XMM0_Dc;
    uVar77 = extraout_XMM0_Dd;
  }
  fVar67 = (pIVar41->super_ImGuiViewport).DpiScale;
  if ((fVar67 != 0.0) || (NAN(fVar67))) {
    if (((fVar55 != fVar67) || (NAN(fVar55) || NAN(fVar67))) &&
       (((pIVar23->IO).ConfigFlags & 0x4000) != 0)) {
      local_48 = fVar55;
      uStack_44 = uVar66;
      uStack_40 = uVar76;
      uStack_3c = uVar77;
      ScaleWindowsInViewport(pIVar41,fVar55 / fVar67);
      fVar55 = local_48;
    }
  }
  (pIVar41->super_ImGuiViewport).DpiScale = fVar55;
  uVar32 = (ulong)(iVar31 + 1);
  goto LAB_00147370;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    NewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}